

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O0

void deqp::egl::Image::checkCallReturn<unsigned_int>
               (EglTestContext *eglTestCtx,char *call,uint returnValue,uint expectReturnValue,
               EGLint expectError)

{
  qpTestResult qVar1;
  MessageBuilder *pMVar2;
  Library *pLVar3;
  Enum<int,_2UL> EVar4;
  Enum<int,_2UL> local_500;
  GetNameFunc local_4f0;
  int local_4e8;
  Enum<int,_2UL> local_4e0;
  MessageBuilder local_4d0;
  MessageBuilder local_350;
  MessageBuilder local_1c0;
  int local_3c;
  TestLog *pTStack_38;
  EGLint error;
  TestLog *log;
  TestContext *testCtx;
  uint local_20;
  EGLint expectError_local;
  uint expectReturnValue_local;
  uint returnValue_local;
  char *call_local;
  EglTestContext *eglTestCtx_local;
  
  testCtx._4_4_ = expectError;
  local_20 = expectReturnValue;
  expectError_local = returnValue;
  _expectReturnValue_local = call;
  call_local = (char *)eglTestCtx;
  log = (TestLog *)EglTestContext::getTestContext(eglTestCtx);
  pTStack_38 = tcu::TestContext::getLog((TestContext *)log);
  tcu::TestLog::operator<<(&local_1c0,pTStack_38,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_1c0,(char **)&expectReturnValue_local);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1c0);
  pLVar3 = EglTestContext::getLibrary((EglTestContext *)call_local);
  local_3c = (*pLVar3->_vptr_Library[0x1f])();
  if (expectError_local != local_20) {
    tcu::TestLog::operator<<(&local_350,pTStack_38,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<
                       (&local_350,(char (*) [41])"  Fail: Return value mismatch! Expected ");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_20);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [7])0x2c59494);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(uint *)&expectError_local);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_350);
    qVar1 = tcu::TestContext::getTestResult((TestContext *)log);
    if (qVar1 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult((TestContext *)log,QP_TEST_RESULT_FAIL,"Invalid return value")
      ;
    }
  }
  if (local_3c != testCtx._4_4_) {
    tcu::TestLog::operator<<(&local_4d0,pTStack_38,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<
                       (&local_4d0,(char (*) [39])"  Fail: Error code mismatch! Expected ");
    EVar4 = eglu::getErrorStr(testCtx._4_4_);
    local_4f0 = EVar4.m_getName;
    local_4e8 = EVar4.m_value;
    local_4e0.m_getName = local_4f0;
    local_4e0.m_value = local_4e8;
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_4e0);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [7])0x2c59494);
    EVar4 = eglu::getErrorStr(local_3c);
    local_500.m_getName = EVar4.m_getName;
    local_500.m_value = EVar4.m_value;
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_500);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4d0);
    qVar1 = tcu::TestContext::getTestResult((TestContext *)log);
    if (qVar1 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult((TestContext *)log,QP_TEST_RESULT_FAIL,"Invalid error code");
    }
  }
  return;
}

Assistant:

void checkCallReturn (EglTestContext& eglTestCtx, const char* call, RetVal returnValue, RetVal expectReturnValue, EGLint expectError)
{
	tcu::TestContext&	testCtx		= eglTestCtx.getTestContext();
	TestLog&			log			= testCtx.getLog();
	EGLint				error;

	log << TestLog::Message << call << TestLog::EndMessage;

	error = eglTestCtx.getLibrary().getError();

	if (returnValue != expectReturnValue)
	{
		log << TestLog::Message << "  Fail: Return value mismatch! Expected " << expectReturnValue << ", got " << returnValue << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid return value");
	}

	if (error != expectError)
	{
		log << TestLog::Message << "  Fail: Error code mismatch! Expected " << eglu::getErrorStr(expectError) << ", got " << eglu::getErrorStr(error) << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid error code");
	}
}